

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O2

void __thiscall
FactorTimer::reportFactorLevel1Clock(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  initializer_list<int> __l;
  allocator_type local_69;
  _Vector_base<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> factor_clock_list;
  int local_38 [8];
  
  local_38[4] = 6;
  local_38[5] = 0xb;
  local_38[6] = 0x1a;
  local_38[7] = 0x1f;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[2] = 3;
  local_38[3] = 4;
  __l._M_len = 8;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&factor_clock_list,__l,&local_69);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_68,&factor_clock_list);
  reportFactorClockList
            (this,"FactorLevel1",factor_timer_clock,(vector<int,_std::allocator<int>_> *)&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&factor_clock_list.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void reportFactorLevel1Clock(HighsTimerClock& factor_timer_clock) {
    std::vector<HighsInt> factor_clock_list{
        FactorInvertSimple, FactorInvertKernel, FactorInvertDeficient,
        FactorInvertFinish, FactorFtranLower,   FactorFtranUpper,
        FactorBtranLower,   FactorBtranUpper};
    reportFactorClockList("FactorLevel1", factor_timer_clock,
                          factor_clock_list);
  }